

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimeline.cpp
# Opt level: O3

void __thiscall QTimeLine::setPaused(QTimeLine *this,bool paused)

{
  int iVar1;
  QObjectData *pQVar2;
  QBindingStatus *pQVar3;
  parameter_type pVar4;
  QObject *sender;
  long in_FS_OFFSET;
  undefined4 local_40;
  undefined1 local_39;
  void *local_38;
  undefined4 *local_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QObject).d_ptr.d;
  iVar1 = *(int *)((long)&pQVar2[2].children.d.d + 4);
  if (iVar1 == 0) {
    setPaused();
    goto LAB_003e9345;
  }
  if (paused && iVar1 != 1) {
    pVar4 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
            ::value((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
                     *)((long)&pQVar2[2].parent + 4));
    *(parameter_type *)&pQVar2[1].bindingStorage.bindingStatus = pVar4;
    QBasicTimer::stop((QBasicTimer *)&pQVar2[1].metaObject);
    if (*(int *)((long)&pQVar2[2].children.d.d + 4) == 1) goto LAB_003e9345;
    sender = pQVar2->q_ptr;
    local_40 = 1;
  }
  else {
    if (iVar1 != 1 || paused) goto LAB_003e9345;
    pQVar3 = (pQVar2->bindingStorage).bindingStatus;
    if ((pQVar3 != (QBindingStatus *)0x0) &&
       (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper
                (&pQVar2->bindingStorage,(QUntypedPropertyData *)&pQVar2[2].q_ptr);
    }
    QBasicTimer::start((QBasicTimer *)&pQVar2[1].metaObject,
                       (Duration)((long)*(int *)&pQVar2[2].q_ptr * 1000000),CoarseTimer,
                       &this->super_QObject);
    pVar4 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
            ::value((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
                     *)((long)&pQVar2[2].parent + 4));
    *(parameter_type *)&pQVar2[1].bindingStorage.bindingStatus = pVar4;
    QElapsedTimer::start((QElapsedTimer *)&pQVar2[1].children.d.size);
    if (*(int *)((long)&pQVar2[2].children.d.d + 4) == 2) goto LAB_003e9345;
    sender = pQVar2->q_ptr;
    local_40 = 2;
  }
  *(undefined4 *)((long)&pQVar2[2].children.d.d + 4) = local_40;
  local_30 = &local_40;
  local_38 = (void *)0x0;
  local_28 = &local_39;
  QMetaObject::activate(sender,&staticMetaObject,2,&local_38);
LAB_003e9345:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimeLine::setPaused(bool paused)
{
    Q_D(QTimeLine);
    if (d->state == NotRunning) {
        qWarning("QTimeLine::setPaused: Not running");
        return;
    }
    if (paused && d->state != Paused) {
        d->startTime = d->currentTime;
        d->basicTimer.stop();
        d->setState(Paused);
    } else if (!paused && d->state == Paused) {
        // Same as resume()
        d->basicTimer.start(d->updateInterval * 1ms, this);
        d->startTime = d->currentTime;
        d->timer.start();
        d->setState(Running);
    }
}